

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c
# Opt level: O1

void array_container_printf_as_uint32_array(array_container_t *v,uint32_t base)

{
  long lVar1;
  
  if ((v->cardinality != 0) && (printf("%u",(ulong)(*v->array + base)), 1 < v->cardinality)) {
    lVar1 = 1;
    do {
      printf(",%u",(ulong)(v->array[lVar1] + base));
      lVar1 = lVar1 + 1;
    } while (lVar1 < v->cardinality);
  }
  return;
}

Assistant:

void array_container_printf_as_uint32_array(const array_container_t *v,
                                            uint32_t base) {
    if (v->cardinality == 0) {
        return;
    }
    printf("%u", v->array[0] + base);
    for (int i = 1; i < v->cardinality; ++i) {
        printf(",%u", v->array[i] + base);
    }
}